

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IEnumerableCore.hpp
# Opt level: O3

void __thiscall
linq::
IEnumerableCore<linq::WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>_>
::iterator::iterator
          (iterator *this,
          WhereState<linq::IEnumerable<int>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_farnyser[P]linq_cpp_tests_tests_cpp:49:44),_int>
          src,bool v)

{
  int iVar1;
  bool in_CL;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_RDX;
  undefined7 in_register_00000031;
  
  (this->source).super_IState<int>._vptr_IState = (_func_int **)&PTR_Init_00156c18;
  (this->source).source.super_IState<int>._vptr_IState = (_func_int **)&PTR_Init_00156bc0;
  (this->source).source.state.super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)CONCAT71(in_register_00000031,v);
  (this->source).source.state.super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = in_RDX;
  if (in_RDX != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      in_RDX->_M_use_count = in_RDX->_M_use_count + 1;
      UNLOCK();
    }
    else {
      in_RDX->_M_use_count = in_RDX->_M_use_count + 1;
    }
  }
  this->valid = in_CL;
  if (in_CL != false) {
    WhereState<linq::IEnumerable<int>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/farnyser[P]linq-cpp/tests/tests.cpp:49:44),_int>
    ::Init(&this->source);
    iVar1 = (*((this->source).source.state.
               super___shared_ptr<linq::IState<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              _vptr_IState[1])();
    this->valid = SUB41(iVar1,0);
  }
  return;
}

Assistant:

iterator(S src, bool v = true) : source(src) {
				valid = v;
				
				if(v) { 
					source.Init();	
					valid = source.Valid();
				}
			}